

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
AdapterPromiseNode<kj::Own<capnp::ClientHook>,_kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>_>_>
::reject(AdapterPromiseNode<kj::Own<capnp::ClientHook>,_kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>_>_>
         *this,Exception *exception)

{
  ExceptionOr<kj::Own<capnp::ClientHook>_> local_180;
  
  if (this->waiting == true) {
    this->waiting = false;
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_180,exception);
    local_180.value.ptr.disposer = (Disposer *)0x0;
    local_180.value.ptr.ptr = (ClientHook *)0x0;
    ExceptionOr<kj::Own<capnp::ClientHook>_>::operator=(&this->result,&local_180);
    ExceptionOr<kj::Own<capnp::ClientHook>_>::~ExceptionOr(&local_180);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }